

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_mapper.h
# Opt level: O2

uint8_t MMC1_read(nes_cartridge *cartridge,uint16_t address)

{
  long lVar1;
  int iVar2;
  undefined6 in_register_00000032;
  byte *pbVar3;
  ulong uVar4;
  
  pbVar3 = (byte *)cartridge->mapper_state;
  iVar2 = (int)CONCAT62(in_register_00000032,address);
  if (0x5fff < (short)address) {
    pbVar3 = pbVar3 + (ulong)(iVar2 - 0x6000) + 0x32;
    goto LAB_00105926;
  }
  if ((*pbVar3 & 3) < 2) {
LAB_0010590f:
    lVar1 = *(long *)(pbVar3 + 0x18);
LAB_00105913:
    uVar4 = ((CONCAT62(in_register_00000032,address) & 0xffffffff) + lVar1) - 0x8000;
  }
  else if ((*pbVar3 & 3) == 2) {
    if (address < 0xc000) {
      lVar1 = *(long *)(pbVar3 + 0x10);
      goto LAB_00105913;
    }
    uVar4 = (ulong)(iVar2 - 0xc000) + *(long *)(pbVar3 + 0x18);
  }
  else {
    if (address < 0xc000) goto LAB_0010590f;
    uVar4 = (ulong)(iVar2 - 0xc000) + *(long *)(pbVar3 + 0x10);
  }
  pbVar3 = cartridge->prg_rom + (uVar4 | *(ulong *)(pbVar3 + 8));
LAB_00105926:
  return *pbVar3;
}

Assistant:

static uint8_t MMC1_read(nes_cartridge* cartridge, uint16_t address)
{
    mmc1_mapper_state* state = (mmc1_mapper_state*)cartridge->mapper_state;

    if (address >= 0x6000 && address <= 0x7FFF)
        return state->ram[address - 0x6000];

    size_t prg_address = state->prg_bank_selector;
    switch (state->bank_mode)
    {
        default:
        case 0: case 1:             prg_address |= state->current_bank_offset + (address - 0x8000); 
        break;
        case 2:
            if (address >= 0xC000)  prg_address |= state->current_bank_offset + (address - 0xC000);
            else                    prg_address |= state->fixed_bank_offset + (address - 0x8000);
        break;
        case 3:
            if (address >= 0xC000)  prg_address |= state->fixed_bank_offset + (address - 0xC000);
            else                    prg_address |= state->current_bank_offset + (address - 0x8000);
        break;
    }

    return cartridge->prg_rom[prg_address];
}